

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystick.c
# Opt level: O2

float * glfwGetJoystickAxes(int joy,int *count)

{
  float *pfVar1;
  int error;
  
  *count = 0;
  if (_glfwInitialized == '\0') {
    error = 0x10001;
  }
  else {
    if ((uint)joy < 0x10) {
      pfVar1 = _glfwPlatformGetJoystickAxes(joy,count);
      return pfVar1;
    }
    error = 0x10003;
  }
  _glfwInputError(error,(char *)0x0);
  return (float *)0x0;
}

Assistant:

GLFWAPI const float* glfwGetJoystickAxes(int joy, int* count)
{
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, NULL);
        return NULL;
    }

    return _glfwPlatformGetJoystickAxes(joy, count);
}